

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decompiler.cc
# Opt level: O2

string * __thiscall
wabt::Decompiler::BinaryToString_abi_cxx11_
          (string *__return_storage_ptr__,Decompiler *this,
          vector<unsigned_char,_std::allocator<unsigned_char>_> *in)

{
  pointer puVar1;
  char cVar2;
  size_type sVar3;
  pointer puVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  std::__cxx11::string::string((string *)__return_storage_ptr__,"\"",(allocator *)&local_50);
  puVar1 = (in->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  sVar3 = 0;
  for (puVar4 = (in->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
                super__Vector_impl_data._M_start; cVar2 = (char)__return_storage_ptr__,
      puVar4 != puVar1; puVar4 = puVar4 + 1) {
    if (0x5e < (byte)(*puVar4 - 0x20)) {
      std::__cxx11::string::push_back(cVar2);
      std::__cxx11::string::push_back(cVar2);
    }
    std::__cxx11::string::push_back(cVar2);
    if (this->target_exp_width < __return_storage_ptr__->_M_string_length - sVar3) {
      if (sVar3 == 0) {
        std::operator+(&local_50,"  ",__return_storage_ptr__);
        std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_50);
        std::__cxx11::string::_M_dispose();
      }
      std::__cxx11::string::append((char *)__return_storage_ptr__);
      sVar3 = __return_storage_ptr__->_M_string_length;
      std::__cxx11::string::append((char *)__return_storage_ptr__);
    }
  }
  std::__cxx11::string::push_back(cVar2);
  return __return_storage_ptr__;
}

Assistant:

std::string BinaryToString(const std::vector<uint8_t> &in) {
    std::string s = "\"";
    size_t line_start = 0;
    static const char s_hexdigits[] = "0123456789abcdef";
    for (auto c : in) {
      if (c >= ' ' && c <= '~') {
        s += c;
      } else {
        s += '\\';
        s += s_hexdigits[c >> 4];
        s += s_hexdigits[c & 0xf];
      }
      if (s.size() - line_start > target_exp_width) {
        if (line_start == 0) {
          s = "  " + s;
        }
        s += "\"\n  ";
        line_start = s.size();
        s += "\"";
      }
    }
    s += '\"';
    return s;
  }